

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional_test.cxx
# Opt level: O3

void check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
               (TestInterface interface,Backend backend,Spin polar,double *args,Kernel *args_1,
               double *args_2,Kernel *args_3)

{
  size_type *this;
  pointer ppVar1;
  size_type sVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  __normal_iterator<const_std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
  _Var7;
  long lVar8;
  undefined8 uVar9;
  pointer pvVar10;
  ulong uVar11;
  size_type sVar12;
  long lVar13;
  ulong uVar14;
  XCKernel *kern;
  pointer pdVar15;
  pointer ppVar16;
  result_type rVar17;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  XCFunctional func;
  double lhs_v;
  double lhs_v_2;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  kern_pairs;
  pair<double,_ExchCXX::XCKernel> p;
  vector<double,_std::allocator<double>_> rho;
  default_random_engine gen;
  vector<double,_std::allocator<double>_> vrho;
  vector<double,_std::allocator<double>_> eps;
  vector<double,_std::allocator<double>_> sigma;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  eps_refs;
  vector<double,_std::allocator<double>_> vsigma;
  vector<double,_std::allocator<double>_> vtau;
  vector<double,_std::allocator<double>_> vlapl;
  vector<double,_std::allocator<double>_> coeffs;
  vector<double,_std::allocator<double>_> tau;
  vector<double,_std::allocator<double>_> lapl;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vrho_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vsigma_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vtau_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vlapl_refs;
  XCFunctional local_2d0;
  double local_2b8;
  double local_2b0;
  ITransientExpression local_2a8;
  double local_298;
  char *local_290;
  undefined8 local_288;
  Approx *local_280;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  local_278;
  TestInterface local_25c;
  AssertionHandler local_258;
  vector<double,_std::allocator<double>_> local_210;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_1f8;
  vector<double,_std::allocator<double>_> local_1f0;
  vector<double,_std::allocator<double>_> local_1d8;
  vector<double,_std::allocator<double>_> local_1c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1a8;
  vector<double,_std::allocator<double>_> local_190;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  vector<double,_std::allocator<double>_> local_128;
  vector<double,_std::allocator<double>_> local_110;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  normal_distribution<double> local_78;
  Approx local_50;
  
  gen_kern_vector<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
            (&local_278,backend,polar,args,args_1,args_2,args_3);
  ExchCXX::XCFunctional::XCFunctional(&local_2d0,&local_278);
  local_148 = (void *)0x0;
  uStack_140 = 0;
  local_138 = 0;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda(auto:1_const&)_1_>
            ((__normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
              )local_278.
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
              )local_278.
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (vector<double,_std::allocator<double>_> *)&local_148);
  ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
  if (local_2d0.kernels_.
      super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_2d0.kernels_.
      super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001642de:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001642f0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00164302:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00164314:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00164326:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    iVar5 = (*(((local_2d0.kernels_.
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
              _vptr_XCKernelImpl[7])();
    std::vector<double,_std::allocator<double>_>::vector
              (&local_210,0x400L << ((byte)iVar5 & 0x3f),(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    ppVar1 = local_2d0.kernels_.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::is_lda()const::_lambda(auto:1_const&)_1_>>
                      (local_2d0.kernels_.
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var7._M_current != ppVar1) {
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      if (local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar6 = (*(((local_2d0.kernels_.
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        sVar12 = (ulong)((uVar6 & 0xff) << 0xb) | 0x400;
        goto LAB_00162e74;
      }
      goto LAB_001642f0;
    }
    sVar12 = 0;
LAB_00162e74:
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1c0,sVar12,(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    ppVar1 = local_2d0.kernels_.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::needs_laplacian()const::_lambda(auto:1_const&)_1_>>
                      (local_2d0.kernels_.
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var7._M_current != ppVar1) {
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      if (local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar5 = (*(((local_2d0.kernels_.
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        sVar12 = 0x400L << ((byte)iVar5 & 0x3f);
        goto LAB_00162edc;
      }
      goto LAB_00164302;
    }
    sVar12 = 0;
LAB_00162edc:
    std::vector<double,_std::allocator<double>_>::vector
              (&local_110,sVar12,(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    ppVar1 = local_2d0.kernels_.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                      (local_2d0.kernels_.
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var7._M_current != ppVar1) {
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      if (local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar5 = (*(((local_2d0.kernels_.
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        sVar12 = 0x400L << ((byte)iVar5 & 0x3f);
        goto LAB_00162f44;
      }
      goto LAB_00164314;
    }
    sVar12 = 0;
LAB_00162f44:
    std::vector<double,_std::allocator<double>_>::vector
              (&local_128,sVar12,(allocator_type *)&local_258);
    local_1f8._M_x = 1;
    local_78._M_param._M_mean = 5.0;
    local_78._M_param._M_stddev = 2.0;
    local_78._M_saved = 0.0;
    local_78._M_saved_available = false;
    if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar15 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        rVar17 = std::normal_distribution<double>::operator()
                           (&local_78,&local_1f8,&local_78._M_param);
        *pdVar15 = rVar17;
        pdVar15 = pdVar15 + 1;
      } while (pdVar15 !=
               local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar15 = local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        rVar17 = std::normal_distribution<double>::operator()
                           (&local_78,&local_1f8,&local_78._M_param);
        *pdVar15 = rVar17;
        pdVar15 = pdVar15 + 1;
      } while (pdVar15 !=
               local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar15 = local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        rVar17 = std::normal_distribution<double>::operator()
                           (&local_78,&local_1f8,&local_78._M_param);
        *pdVar15 = rVar17;
        pdVar15 = pdVar15 + 1;
      } while (pdVar15 !=
               local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar15 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        rVar17 = std::normal_distribution<double>::operator()
                           (&local_78,&local_1f8,&local_78._M_param);
        *pdVar15 = rVar17;
        pdVar15 = pdVar15 + 1;
      } while (pdVar15 !=
               local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    ppVar1 = local_278.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_25c = interface;
    if (local_278.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_278.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this = &local_258.m_assertionInfo.macroName.m_size;
      ppVar16 = local_278.
                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_258.m_assertionInfo.macroName.m_start = (char *)ppVar16->first;
        ExchCXX::XCKernel::XCKernel((XCKernel *)this,&ppVar16->second);
        local_2a8._vptr_ITransientExpression = (_func_int **)0x400;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::emplace_back<unsigned_long>(&local_1a8,(unsigned_long *)&local_2a8);
        iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x38))();
        local_2a8._vptr_ITransientExpression = (_func_int **)(0x400L << ((byte)iVar5 & 0x3f));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::emplace_back<unsigned_long>(&local_f8,(unsigned_long *)&local_2a8);
        sVar2 = local_258.m_assertionInfo.macroName.m_size;
        iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x18))
                          (local_258.m_assertionInfo.macroName.m_size);
        if ((char)iVar5 == '\0') {
          uVar6 = (**(code **)(*(long *)sVar2 + 0x38))(sVar2);
          local_2a8._vptr_ITransientExpression =
               (_func_int **)((ulong)((uVar6 & 0xff) << 0xb) | 0x400);
        }
        else {
          local_2a8._vptr_ITransientExpression = (_func_int **)0x0;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::emplace_back<unsigned_long>(&local_d8,(unsigned_long *)&local_2a8);
        sVar2 = local_258.m_assertionInfo.macroName.m_size;
        iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x48))
                          (local_258.m_assertionInfo.macroName.m_size);
        if ((char)iVar5 == '\0') {
          local_2a8._vptr_ITransientExpression = (_func_int **)0x0;
        }
        else {
          iVar5 = (**(code **)(*(long *)sVar2 + 0x38))(sVar2);
          local_2a8._vptr_ITransientExpression = (_func_int **)(0x400L << ((byte)iVar5 & 0x3f));
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::emplace_back<unsigned_long>(&local_98,(unsigned_long *)&local_2a8);
        sVar2 = local_258.m_assertionInfo.macroName.m_size;
        iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x28))
                          (local_258.m_assertionInfo.macroName.m_size);
        if ((char)iVar5 == '\0') {
          local_2a8._vptr_ITransientExpression = (_func_int **)0x0;
        }
        else {
          iVar5 = (**(code **)(*(long *)sVar2 + 0x38))(sVar2);
          local_2a8._vptr_ITransientExpression = (_func_int **)(0x400L << ((byte)iVar5 & 0x3f));
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::emplace_back<unsigned_long>(&local_b8,(unsigned_long *)&local_2a8);
        if (interface == EXC_VXC) {
          iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x18))();
          if ((char)iVar5 == '\0') {
            iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x20))();
            if ((char)iVar5 == '\0') {
              iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x28))();
              if ((char)iVar5 != '\0') {
                (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0xb0))
                          (local_258.m_assertionInfo.macroName.m_size,0x400,
                           local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1a8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_f8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_d8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_98.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_b8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
                interface = local_25c;
              }
            }
            else {
              (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x90))
                        (local_258.m_assertionInfo.macroName.m_size,0x400,
                         local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1a8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_f8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_d8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x70))
                      (local_258.m_assertionInfo.macroName.m_size,0x400,
                       local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_1a8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_f8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
        else if (interface == EXC) {
          iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x18))();
          if ((char)iVar5 == '\0') {
            iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x20))();
            if ((char)iVar5 == '\0') {
              iVar5 = (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x28))();
              if ((char)iVar5 != '\0') {
                (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0xa8))
                          (local_258.m_assertionInfo.macroName.m_size,0x400,
                           local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1a8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
              }
            }
            else {
              (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x88))
                        (local_258.m_assertionInfo.macroName.m_size,0x400,
                         local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1a8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*(long *)local_258.m_assertionInfo.macroName.m_size + 0x68))
                      (local_258.m_assertionInfo.macroName.m_size,0x400,
                       local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_1a8.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
        ExchCXX::XCKernel::~XCKernel((XCKernel *)this);
        ppVar16 = ppVar16 + 1;
      } while (ppVar16 != ppVar1);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1d8,0x400,(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    if (local_2d0.kernels_.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2d0.kernels_.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_001642de;
    iVar5 = (*(((local_2d0.kernels_.
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
              _vptr_XCKernelImpl[7])();
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1f0,0x400L << ((byte)iVar5 & 0x3f),(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    ppVar1 = local_2d0.kernels_.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::is_lda()const::_lambda(auto:1_const&)_1_>>
                      (local_2d0.kernels_.
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var7._M_current != ppVar1) {
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      if (local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2d0.kernels_.
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar6 = (*(((local_2d0.kernels_.
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        sVar12 = (ulong)((uVar6 & 0xff) << 0xb) | 0x400;
        goto LAB_00163568;
      }
      goto LAB_00164326;
    }
    sVar12 = 0;
LAB_00163568:
    std::vector<double,_std::allocator<double>_>::vector
              (&local_190,sVar12,(allocator_type *)&local_258);
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    ppVar1 = local_2d0.kernels_.
             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::needs_laplacian()const::_lambda(auto:1_const&)_1_>>
                      (local_2d0.kernels_.
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (_Var7._M_current == ppVar1) {
      sVar12 = 0;
LAB_001635d0:
      std::vector<double,_std::allocator<double>_>::vector
                (&local_160,sVar12,(allocator_type *)&local_258);
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      ppVar1 = local_2d0.kernels_.
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                        (local_2d0.kernels_.
                         super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (_Var7._M_current == ppVar1) {
        sVar12 = 0;
      }
      else {
        ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
        if (local_2d0.kernels_.
            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_2d0.kernels_.
            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_0016434a;
        iVar5 = (*(((local_2d0.kernels_.
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        sVar12 = 0x400L << ((byte)iVar5 & 0x3f);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_178,sVar12,(allocator_type *)&local_258);
      ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
      ppVar1 = local_2d0.kernels_.
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::is_lda()const::_lambda(auto:1_const&)_1_>>
                        (local_2d0.kernels_.
                         super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_2d0.kernels_.
                         super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var7._M_current == ppVar1) {
        ExchCXX::XCFunctional::eval_exc_vxc
                  (&local_2d0,0x400,
                   local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
      else {
        ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
        ppVar1 = local_2d0.kernels_.
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_gga()const::_lambda(auto:1_const&)_1_>>
                          (local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (_Var7._M_current != ppVar1) {
          ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
          ppVar1 = local_2d0.kernels_.
                   super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                            (local_2d0.kernels_.
                             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_2d0.kernels_.
                             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          if (_Var7._M_current == ppVar1) {
            ExchCXX::XCFunctional::eval_exc_vxc
                      (&local_2d0,0x400,
                       local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
            goto LAB_001637b2;
          }
        }
        ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
        ppVar1 = local_2d0.kernels_.
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                          (local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (_Var7._M_current != ppVar1) {
          ExchCXX::XCFunctional::eval_exc_vxc
                    (&local_2d0,0x400,
                     local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
      }
LAB_001637b2:
      if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          if ((long)local_278.
                    super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.
                    super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0) {
            local_2b0 = 0.0;
          }
          else {
            lVar8 = (long)local_278.
                          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_278.
                          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            local_2b0 = 0.0;
            lVar13 = 0;
            pvVar10 = local_1a8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_2b0 = local_2b0 +
                          *(double *)((long)local_148 + lVar13 * 8) *
                          (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar11];
              lVar13 = lVar13 + 1;
              pvVar10 = pvVar10 + 1;
            } while (lVar8 + (ulong)(lVar8 == 0) != lVar13);
          }
          local_2a8._vptr_ITransientExpression = (_func_int **)0x101c194;
          local_2a8.m_isBinaryExpression = true;
          local_2a8.m_result = true;
          local_2a8._10_6_ = 0;
          macroName.m_size = 5;
          macroName.m_start = "CHECK";
          capturedExpression.m_size = 0x1b;
          capturedExpression.m_start = "eps[i] == Approx( ref_val )";
          Catch::AssertionHandler::AssertionHandler
                    (&local_258,macroName,(SourceLineInfo *)&local_2a8,capturedExpression,
                     ContinueOnFailure);
          local_2b8 = local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
          Catch::Approx::Approx(&local_50,local_2b0);
          bVar3 = Catch::Approx::equalityComparisonImpl(&local_50,local_2b8);
          local_2a8.m_result = bVar3;
          local_2a8.m_isBinaryExpression = true;
          local_2a8._vptr_ITransientExpression =
               (_func_int **)&PTR_streamReconstructedExpression_010f1980;
          local_298 = local_2b8;
          local_290 = "==";
          local_288 = 2;
          local_280 = &local_50;
          Catch::AssertionHandler::handleExpr(&local_258,&local_2a8);
          Catch::AssertionHandler::complete(&local_258);
          if (local_258.m_completed == false) {
            (*(local_258.m_resultCapture)->_vptr_IResultCapture[0x14])();
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_1d8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_1d8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      if (local_25c != EXC) {
        if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar11 = 0;
          do {
            if ((long)local_278.
                      super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_278.
                      super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0) {
              local_2b0 = 0.0;
            }
            else {
              lVar8 = (long)local_278.
                            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_278.
                            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4;
              local_2b0 = 0.0;
              lVar13 = 0;
              pvVar10 = local_f8.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_2b0 = local_2b0 +
                            *(double *)((long)local_148 + lVar13 * 8) *
                            (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                lVar13 = lVar13 + 1;
                pvVar10 = pvVar10 + 1;
              } while (lVar8 + (ulong)(lVar8 == 0) != lVar13);
            }
            local_2a8._vptr_ITransientExpression = (_func_int **)0x101c194;
            local_2a8.m_isBinaryExpression = true;
            local_2a8.m_result = true;
            local_2a8._10_6_ = 0;
            macroName_00.m_size = 5;
            macroName_00.m_start = "CHECK";
            capturedExpression_00.m_size = 0x1c;
            capturedExpression_00.m_start = "vrho[i] == Approx( ref_val )";
            Catch::AssertionHandler::AssertionHandler
                      (&local_258,macroName_00,(SourceLineInfo *)&local_2a8,capturedExpression_00,
                       ContinueOnFailure);
            local_2b8 = local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar11];
            Catch::Approx::Approx(&local_50,local_2b0);
            bVar3 = Catch::Approx::equalityComparisonImpl(&local_50,local_2b8);
            local_2a8.m_result = bVar3;
            local_2a8.m_isBinaryExpression = true;
            local_2a8._vptr_ITransientExpression =
                 (_func_int **)&PTR_streamReconstructedExpression_010f1980;
            local_298 = local_2b8;
            local_290 = "==";
            local_288 = 2;
            local_280 = &local_50;
            Catch::AssertionHandler::handleExpr(&local_258,&local_2a8);
            Catch::AssertionHandler::complete(&local_258);
            if (local_258.m_completed == false) {
              (*(local_258.m_resultCapture)->_vptr_IResultCapture[0x14])();
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)local_1f0.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1f0.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3));
        }
        ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
        ppVar1 = local_2d0.kernels_.
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_gga()const::_lambda(auto:1_const&)_1_>>
                          (local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (_Var7._M_current != ppVar1) {
          ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
          ppVar1 = local_2d0.kernels_.
                   super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                            (local_2d0.kernels_.
                             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_2d0.kernels_.
                             super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          if ((_Var7._M_current == ppVar1) &&
             (local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start)) {
            uVar11 = 0;
            do {
              if (local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_2b8 = 0.0;
              }
              else {
                local_2b8 = 0.0;
                lVar8 = 8;
                lVar13 = 0;
                uVar14 = 0;
                do {
                  cVar4 = (**(code **)(**(long **)((long)&(local_278.
                                                                                                                      
                                                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first
                                                  + lVar8) + 0x20))();
                  if (cVar4 != '\0') {
                    local_2b8 = local_2b8 +
                                *(double *)((long)local_148 + uVar14 * 8) *
                                *(double *)
                                 (*(long *)((long)&((local_d8.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           lVar13) + uVar11 * 8);
                  }
                  uVar14 = uVar14 + 1;
                  lVar13 = lVar13 + 0x18;
                  lVar8 = lVar8 + 0x10;
                } while (uVar14 < (ulong)((long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
              local_2a8._vptr_ITransientExpression = (_func_int **)0x101c194;
              local_2a8.m_isBinaryExpression = true;
              local_2a8.m_result = true;
              local_2a8._10_6_ = 0;
              macroName_03.m_size = 5;
              macroName_03.m_start = "CHECK";
              capturedExpression_03.m_size = 0x1e;
              capturedExpression_03.m_start = "vsigma[i] == Approx( ref_val )";
              Catch::AssertionHandler::AssertionHandler
                        (&local_258,macroName_03,(SourceLineInfo *)&local_2a8,capturedExpression_03,
                         ContinueOnFailure);
              local_2b0 = local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11];
              Catch::Approx::Approx(&local_50,local_2b8);
              bVar3 = Catch::Approx::equalityComparisonImpl(&local_50,local_2b0);
              local_2a8.m_result = bVar3;
              local_2a8.m_isBinaryExpression = true;
              local_2a8._vptr_ITransientExpression =
                   (_func_int **)&PTR_streamReconstructedExpression_010f1980;
              local_298 = local_2b0;
              local_290 = "==";
              local_288 = 2;
              local_280 = &local_50;
              Catch::AssertionHandler::handleExpr(&local_258,&local_2a8);
              Catch::AssertionHandler::complete(&local_258);
              if (local_258.m_completed == false) {
                (*(local_258.m_resultCapture)->_vptr_IResultCapture[0x14])
                          (local_258.m_resultCapture,&local_258);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)local_190.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_190.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                          (local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2d0.kernels_.
                           super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (_Var7._M_current !=
            local_2d0.kernels_.
            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar11 = 0;
            do {
              if (local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_2b8 = 0.0;
              }
              else {
                local_2b8 = 0.0;
                lVar8 = 8;
                lVar13 = 0;
                uVar14 = 0;
                do {
                  cVar4 = (**(code **)(**(long **)((long)&(local_278.
                                                                                                                      
                                                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first
                                                  + lVar8) + 0x48))();
                  if (cVar4 != '\0') {
                    local_2b8 = local_2b8 +
                                *(double *)((long)local_148 + uVar14 * 8) *
                                *(double *)
                                 (*(long *)((long)&((local_98.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           lVar13) + uVar11 * 8);
                  }
                  uVar14 = uVar14 + 1;
                  lVar13 = lVar13 + 0x18;
                  lVar8 = lVar8 + 0x10;
                } while (uVar14 < (ulong)((long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
              local_2a8._vptr_ITransientExpression = (_func_int **)0x101c194;
              local_2a8.m_isBinaryExpression = true;
              local_2a8.m_result = true;
              local_2a8._10_6_ = 0;
              macroName_01.m_size = 5;
              macroName_01.m_start = "CHECK";
              capturedExpression_01.m_size = 0x1d;
              capturedExpression_01.m_start = "vlapl[i] == Approx( ref_val )";
              Catch::AssertionHandler::AssertionHandler
                        (&local_258,macroName_01,(SourceLineInfo *)&local_2a8,capturedExpression_01,
                         ContinueOnFailure);
              local_2b0 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11];
              Catch::Approx::Approx(&local_50,local_2b8);
              bVar3 = Catch::Approx::equalityComparisonImpl(&local_50,local_2b0);
              local_2a8.m_result = bVar3;
              local_2a8.m_isBinaryExpression = true;
              local_2a8._vptr_ITransientExpression =
                   (_func_int **)&PTR_streamReconstructedExpression_010f1980;
              local_298 = local_2b0;
              local_290 = "==";
              local_288 = 2;
              local_280 = &local_50;
              Catch::AssertionHandler::handleExpr(&local_258,&local_2a8);
              Catch::AssertionHandler::complete(&local_258);
              if (local_258.m_completed == false) {
                (*(local_258.m_resultCapture)->_vptr_IResultCapture[0x14])
                          (local_258.m_resultCapture,&local_258);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)local_160.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_160.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar11 = 0;
            do {
              if (local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_278.
                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_2b8 = 0.0;
              }
              else {
                local_2b8 = 0.0;
                lVar8 = 8;
                lVar13 = 0;
                uVar14 = 0;
                do {
                  cVar4 = (**(code **)(**(long **)((long)&(local_278.
                                                                                                                      
                                                  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first
                                                  + lVar8) + 0x28))();
                  if (cVar4 != '\0') {
                    local_2b8 = local_2b8 +
                                *(double *)((long)local_148 + uVar14 * 8) *
                                *(double *)
                                 (*(long *)((long)&((local_b8.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           lVar13) + uVar11 * 8);
                  }
                  uVar14 = uVar14 + 1;
                  lVar13 = lVar13 + 0x18;
                  lVar8 = lVar8 + 0x10;
                } while (uVar14 < (ulong)((long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
              local_2a8._vptr_ITransientExpression = (_func_int **)0x101c194;
              local_2a8.m_isBinaryExpression = true;
              local_2a8.m_result = true;
              local_2a8._10_6_ = 0;
              macroName_02.m_size = 5;
              macroName_02.m_start = "CHECK";
              capturedExpression_02.m_size = 0x1c;
              capturedExpression_02.m_start = "vtau[i] == Approx( ref_val )";
              Catch::AssertionHandler::AssertionHandler
                        (&local_258,macroName_02,(SourceLineInfo *)&local_2a8,capturedExpression_02,
                         ContinueOnFailure);
              local_2b0 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11];
              Catch::Approx::Approx(&local_50,local_2b8);
              bVar3 = Catch::Approx::equalityComparisonImpl(&local_50,local_2b0);
              local_2a8.m_result = bVar3;
              local_2a8.m_isBinaryExpression = true;
              local_2a8._vptr_ITransientExpression =
                   (_func_int **)&PTR_streamReconstructedExpression_010f1980;
              local_298 = local_2b0;
              local_290 = "==";
              local_288 = 2;
              local_280 = &local_50;
              Catch::AssertionHandler::handleExpr(&local_258,&local_2a8);
              Catch::AssertionHandler::complete(&local_258);
              if (local_258.m_completed == false) {
                (*(local_258.m_resultCapture)->_vptr_IResultCapture[0x14])
                          (local_258.m_resultCapture,&local_258);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)local_178.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_178.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
      }
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_98);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_f8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_1a8);
      if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (result_type *)0x0) {
        operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (result_type *)0x0) {
        operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (result_type *)0x0) {
        operator_delete(local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (const_host_buffer_type)0x0) {
        operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_148 != (void *)0x0) {
        operator_delete(local_148,local_138 - (long)local_148);
      }
      std::
      vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
      ::~vector(&local_2d0.kernels_);
      std::
      vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
      ::~vector(&local_278);
      return;
    }
    ExchCXX::XCFunctional::throw_if_not_sane(&local_2d0);
    if (local_2d0.kernels_.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2d0.kernels_.
        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar5 = (*(((local_2d0.kernels_.
                   super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                _vptr_XCKernelImpl[7])();
      sVar12 = 0x400L << ((byte)iVar5 & 0x3f);
      goto LAB_001635d0;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0016434a:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __cxa_end_catch();
  Catch::AssertionHandler::~AssertionHandler(&local_258);
  if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (host_buffer_type)0x0) {
    operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (host_buffer_type)0x0) {
    operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (host_buffer_type)0x0) {
    operator_delete(local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (host_buffer_type)0x0) {
    operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (host_buffer_type)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1a8);
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (result_type *)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (result_type *)0x0) {
    operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (result_type *)0x0) {
    operator_delete(local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (result_type *)0x0) {
    operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::~vector(&local_2d0.kernels_);
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::~vector(&local_278);
  _Unwind_Resume(uVar9);
}

Assistant:

void check_correctness( TestInterface interface, Backend backend, Spin polar, 
  Args&&... args ) {

  auto kern_pairs = gen_kern_vector( backend, polar, std::forward<Args>(args)... );
  XCFunctional func( kern_pairs );

  std::vector<double> coeffs;
  std::for_each( kern_pairs.begin(), kern_pairs.end(), 
    [&](const auto& a){ coeffs.emplace_back( a.first ); } 
  );

  size_t npts = 1024;

  std::vector<double>
    rho( func.rho_buffer_len(npts) ),
    sigma( func.sigma_buffer_len(npts) ),
    lapl( func.lapl_buffer_len(npts) ),
    tau( func.tau_buffer_len(npts) );

  // Randomly generate Rho / Sigma
  std::default_random_engine gen;
  std::normal_distribution<> dist(5.0,2.0);
  std::generate( rho.begin(), rho.end(), 
    [&](){ return dist(gen); } );
  std::generate( sigma.begin(), sigma.end(), 
    [&](){ return dist(gen); } );
  std::generate( lapl.begin(), lapl.end(), 
    [&](){ return dist(gen); } );
  std::generate( tau.begin(), tau.end(), 
    [&](){ return dist(gen); } );


  // Evaluate individual kernels
  std::vector< std::vector<double> >
    eps_refs, vrho_refs, vsigma_refs, vlapl_refs, vtau_refs;

  for( auto p : kern_pairs ) {

    XCKernel& kern = p.second;
    //double    f    = p.first;

    eps_refs.emplace_back( kern.exc_buffer_len(npts) );
    vrho_refs.emplace_back( kern.vrho_buffer_len(npts) );
    vsigma_refs.emplace_back( kern.vsigma_buffer_len(npts) );
    vlapl_refs.emplace_back( kern.vlapl_buffer_len(npts) );
    vtau_refs.emplace_back( kern.vtau_buffer_len(npts) );

    if( interface == TestInterface::EXC ) {

      if( kern.is_lda() )
        kern.eval_exc( npts, rho.data(), eps_refs.back().data() );
      else if( kern.is_gga() )
        kern.eval_exc( npts, rho.data(), sigma.data(), 
          eps_refs.back().data() );
      else if( kern.is_mgga() )
        kern.eval_exc( npts, rho.data(), sigma.data(), lapl.data(), tau.data(),
          eps_refs.back().data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      if( kern.is_lda() )
        kern.eval_exc_vxc( npts, rho.data(), eps_refs.back().data(), 
          vrho_refs.back().data() );
      else if( kern.is_gga() )
        kern.eval_exc_vxc( npts, rho.data(), sigma.data(), 
          eps_refs.back().data(), vrho_refs.back().data(),
          vsigma_refs.back().data() );
      else if( kern.is_mgga() )
        kern.eval_exc_vxc( npts, rho.data(), sigma.data(), 
          lapl.data(), tau.data(), eps_refs.back().data(), 
          vrho_refs.back().data(), vsigma_refs.back().data(),
          vlapl_refs.back().data(), vtau_refs.back().data() );

    }
    
  }

  
  // Evaluation combined functional
  std::vector<double>
    eps( func.exc_buffer_len( npts ) ),
    vrho( func.vrho_buffer_len( npts ) ),
    vsigma( func.vsigma_buffer_len( npts ) ),
    vlapl( func.vlapl_buffer_len( npts ) ),
    vtau( func.vtau_buffer_len( npts ) );

  if( func.is_lda() )
    func.eval_exc_vxc( npts, rho.data(), eps.data(), vrho.data() );
  else if( func.is_gga() )
    func.eval_exc_vxc( npts, rho.data(), sigma.data(), 
      eps.data(), vrho.data(), vsigma.data() );
  else if( func.is_mgga() )
    func.eval_exc_vxc( npts, rho.data(), sigma.data(), 
      lapl.data(), tau.data(), eps.data(), vrho.data(), 
      vsigma.data(), vlapl.data(), vtau.data() );


  for( auto i = 0ul; i < eps.size(); ++i ) {
    double ref_val = 0.;
    for( auto j = 0ul; j < kern_pairs.size(); ++j )
      ref_val += coeffs[j] * eps_refs[j][i];
    CHECK( eps[i] == Approx( ref_val ) );
  }

  if( interface != TestInterface::EXC ) {

    for( auto i = 0ul; i < vrho.size(); ++i ) {
      double ref_val = 0.;
      for( auto j = 0ul; j < kern_pairs.size(); ++j )
        ref_val += coeffs[j] * vrho_refs[j][i];
      CHECK( vrho[i] == Approx( ref_val ) );
    }

    if( func.is_gga() ) 
      for( auto i = 0ul; i < vsigma.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.is_gga() )
          ref_val += coeffs[j] * vsigma_refs[j][i];

        CHECK( vsigma[i] == Approx( ref_val ) );
      }

    if( func.is_mgga() )  {
      for( auto i = 0ul; i < vlapl.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.needs_laplacian() )
          ref_val += coeffs[j] * vlapl_refs[j][i];

        CHECK( vlapl[i] == Approx( ref_val ) );
      }
      for( auto i = 0ul; i < vtau.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.is_mgga() )
          ref_val += coeffs[j] * vtau_refs[j][i];

        CHECK( vtau[i] == Approx( ref_val ) );
      }
    }

  }

}